

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__reduce_png(stbi__png *p)

{
  stbi_uc *__ptr;
  int iVar1;
  stbi_uc *psVar2;
  stbi__uint16 *orig;
  stbi_uc *reduced;
  int img_len;
  int i;
  stbi__png *p_local;
  
  iVar1 = p->s->img_x * p->s->img_y * p->s->img_out_n;
  __ptr = p->out;
  if (p->depth == 0x10) {
    psVar2 = (stbi_uc *)stbi__malloc((long)iVar1);
    if (p == (stbi__png *)0x0) {
      p_local._4_4_ = stbi__err("outofmem");
    }
    else {
      for (reduced._4_4_ = 0; reduced._4_4_ < iVar1; reduced._4_4_ = reduced._4_4_ + 1) {
        psVar2[reduced._4_4_] =
             (stbi_uc)((ushort)*(undefined2 *)(__ptr + (long)reduced._4_4_ * 2) >> 8);
      }
      p->out = psVar2;
      free(__ptr);
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static int stbi__reduce_png(stbi__png *p)
{
   int i;
   int img_len = p->s->img_x * p->s->img_y * p->s->img_out_n;
   stbi_uc *reduced;
   stbi__uint16 *orig = (stbi__uint16*)p->out;

   if (p->depth != 16) return 1; // don't need to do anything if not 16-bit data

   reduced = (stbi_uc *)stbi__malloc(img_len);
   if (p == NULL) return stbi__err("outofmem", "Out of memory");

   for (i = 0; i < img_len; ++i) reduced[i] = (stbi_uc)((orig[i] >> 8) & 0xFF); // top half of each byte is a decent approx of 16->8 bit scaling

   p->out = reduced;
   STBI_FREE(orig);

   return 1;
}